

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O2

Function * __thiscall
wasm::anon_unknown_225::FunctionSplitter::copyFunction
          (FunctionSplitter *this,Function *func,string *prefix)

{
  Module *func_00;
  Function *pFVar1;
  char *in_RCX;
  char *in_R8;
  Name NVar2;
  Name newName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  IString local_38;
  
  std::operator+(&local_58,"byn-split-",prefix);
  std::__cxx11::string::operator=((string *)prefix,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  func_00 = this->module;
  std::operator+(&local_98,prefix,'$');
  IString::toString_abi_cxx11_(&local_78,(IString *)func);
  std::operator+(&local_58,&local_98,&local_78);
  IString::IString(&local_38,&local_58);
  NVar2.super_IString.str._M_str = in_RCX;
  NVar2.super_IString.str._M_len = (size_t)local_38.str._M_str;
  NVar2 = Names::getValidFunctionName((Names *)func_00,(Module *)local_38.str._M_len,NVar2);
  newName.super_IString.str._M_str = in_R8;
  newName.super_IString.str._M_len = (size_t)NVar2.super_IString.str._M_str;
  pFVar1 = wasm::ModuleUtils::copyFunction
                     ((ModuleUtils *)func,(Function *)func_00,NVar2.super_IString.str._M_len,newName
                     );
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return pFVar1;
}

Assistant:

Function* copyFunction(Function* func, std::string prefix) {
    // TODO: We copy quite a lot more than we need here, and throw stuff out.
    //       It is simple to just copy the entire thing to get the params and
    //       results and all that, but we could be more efficient.
    prefix = "byn-split-" + prefix;
    return ModuleUtils::copyFunction(
      func,
      *module,
      Names::getValidFunctionName(*module,
                                  prefix + '$' + func->name.toString()));
  }